

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalInsert::Deserialize(LogicalInsert *this,Deserializer *deserializer)

{
  pointer puVar1;
  undefined1 uVar2;
  OnConflictAction OVar3;
  int iVar4;
  uint uVar5;
  LogicalInsert *this_00;
  ClientContext *context;
  pointer pLVar6;
  idx_t iVar7;
  undefined4 extraout_var_00;
  pointer *__ptr;
  byte bVar8;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var9;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var10;
  undefined1 auVar11 [8];
  unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true> result;
  string str;
  _Head_base<0UL,_duckdb::LogicalInsert_*,_false> local_58;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_50;
  undefined1 local_48 [8];
  pointer puStack_40;
  _Alloc_hider local_38;
  undefined4 extraout_var;
  
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"table_info");
  auVar11 = (undefined1  [8])0x0;
  if ((char)iVar4 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar4 == '\0') {
      auVar11 = (undefined1  [8])0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      CreateInfo::Deserialize((CreateInfo *)local_48,deserializer);
      auVar11 = local_48;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (LogicalInsert *)operator_new(0x1d0);
  context = Deserializer::Get<duckdb::ClientContext&>(deserializer);
  local_50._M_head_impl = (CreateInfo *)auVar11;
  LogicalInsert(this_00,context,
                (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                &local_50);
  local_58._M_head_impl = this_00;
  if (local_50._M_head_impl != (CreateInfo *)0x0) {
    (*((local_50._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  local_50._M_head_impl = (CreateInfo *)0x0;
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,true>>
            (deserializer,0xc9,"insert_values",&pLVar6->insert_values);
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xca,"column_index_map");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  IndexVector<unsigned_long,_duckdb::PhysicalIndex>::Deserialize
            ((IndexVector<unsigned_long,_duckdb::PhysicalIndex> *)local_48,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  puVar1 = (pLVar6->column_index_map).internal_vector.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pLVar6->column_index_map).internal_vector.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_48;
  (pLVar6->column_index_map).internal_vector.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = puStack_40;
  (pLVar6->column_index_map).internal_vector.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_38._M_p;
  local_48 = (undefined1  [8])0x0;
  puStack_40 = (pointer)0x0;
  local_38._M_p = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0xcb,"expected_types",&pLVar6->expected_types);
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  uVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcc,"table_index");
  if ((char)uVar5 == '\0') {
    iVar7 = 0;
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar7 = CONCAT44(extraout_var,iVar4);
  }
  pLVar6->table_index = iVar7;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar5 & 0xff));
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  uVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcd,"return_chunk");
  if ((char)uVar5 == '\0') {
    uVar2 = false;
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar2 = (undefined1)iVar4;
  }
  pLVar6->return_chunk = (bool)uVar2;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar5 & 0xff));
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (deserializer,0xce,"bound_defaults",&pLVar6->bound_defaults);
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcf,"action_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_48,deserializer);
    OVar3 = EnumUtil::FromString<duckdb::OnConflictAction>((char *)local_48);
    if (local_48 != (undefined1  [8])&stack0xffffffffffffffc8) {
      operator_delete((void *)local_48);
    }
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    OVar3 = (OnConflictAction)iVar4;
  }
  pLVar6->action_type = OVar3;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0xd0,"expected_set_types",&pLVar6->expected_set_types);
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  Deserializer::
  ReadPropertyWithDefault<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
            (deserializer,0xd1,"on_conflict_filter",&pLVar6->on_conflict_filter);
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd2,"on_conflict_condition");
  bVar8 = (byte)iVar4;
  if (bVar8 == 0) {
    _Var9._M_head_impl =
         (pLVar6->on_conflict_condition).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pLVar6->on_conflict_condition).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    if (_Var9._M_head_impl != (Expression *)0x0) goto LAB_005c2928;
    bVar8 = 0;
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar4 == '\0') {
      _Var10._M_head_impl = (Expression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      Expression::Deserialize((Expression *)local_48,deserializer);
      _Var10._M_head_impl = (Expression *)local_48;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var9._M_head_impl =
         (pLVar6->on_conflict_condition).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pLVar6->on_conflict_condition).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var10._M_head_impl;
    if (_Var9._M_head_impl == (Expression *)0x0) {
      bVar8 = 1;
    }
    else {
LAB_005c2928:
      (*((_Var9._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar8);
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd3,"do_update_condition");
  bVar8 = (byte)iVar4;
  if (bVar8 == 0) {
    _Var9._M_head_impl =
         (pLVar6->do_update_condition).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pLVar6->do_update_condition).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    if (_Var9._M_head_impl == (Expression *)0x0) {
      bVar8 = 0;
      goto LAB_005c29e4;
    }
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar4 == '\0') {
      _Var10._M_head_impl = (Expression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      Expression::Deserialize((Expression *)local_48,deserializer);
      _Var10._M_head_impl = (Expression *)local_48;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var9._M_head_impl =
         (pLVar6->do_update_condition).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pLVar6->do_update_condition).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var10._M_head_impl;
    if (_Var9._M_head_impl == (Expression *)0x0) {
      bVar8 = 1;
      goto LAB_005c29e4;
    }
  }
  (*((_Var9._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
LAB_005c29e4:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar8);
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::PhysicalIndex,true>>
            (deserializer,0xd4,"set_columns",&pLVar6->set_columns);
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0xd5,"set_types",&pLVar6->set_types);
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  uVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd6,"excluded_table_index");
  if ((char)uVar5 == '\0') {
    iVar7 = 0;
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar7 = CONCAT44(extraout_var_00,iVar4);
  }
  pLVar6->excluded_table_index = iVar7;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar5 & 0xff));
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (deserializer,0xd7,"columns_to_fetch",&pLVar6->columns_to_fetch);
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (deserializer,0xd8,"source_columns",&pLVar6->source_columns);
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (deserializer,0xd9,"expressions",&(pLVar6->super_LogicalOperator).expressions);
  pLVar6 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_58);
  uVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xda,"update_is_del_and_insert");
  if ((char)uVar5 == '\0') {
    uVar2 = false;
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar2 = (undefined1)iVar4;
  }
  pLVar6->update_is_del_and_insert = (bool)uVar2;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar5 & 0xff));
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalInsert::Deserialize(Deserializer &deserializer) {
	auto table_info = deserializer.ReadPropertyWithDefault<unique_ptr<CreateInfo>>(200, "table_info");
	auto result = duckdb::unique_ptr<LogicalInsert>(new LogicalInsert(deserializer.Get<ClientContext &>(), std::move(table_info)));
	deserializer.ReadPropertyWithDefault<vector<vector<unique_ptr<Expression>>>>(201, "insert_values", result->insert_values);
	deserializer.ReadProperty<IndexVector<idx_t, PhysicalIndex>>(202, "column_index_map", result->column_index_map);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(203, "expected_types", result->expected_types);
	deserializer.ReadPropertyWithDefault<idx_t>(204, "table_index", result->table_index);
	deserializer.ReadPropertyWithDefault<bool>(205, "return_chunk", result->return_chunk);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(206, "bound_defaults", result->bound_defaults);
	deserializer.ReadProperty<OnConflictAction>(207, "action_type", result->action_type);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(208, "expected_set_types", result->expected_set_types);
	deserializer.ReadPropertyWithDefault<unordered_set<idx_t>>(209, "on_conflict_filter", result->on_conflict_filter);
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(210, "on_conflict_condition", result->on_conflict_condition);
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(211, "do_update_condition", result->do_update_condition);
	deserializer.ReadPropertyWithDefault<vector<PhysicalIndex>>(212, "set_columns", result->set_columns);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(213, "set_types", result->set_types);
	deserializer.ReadPropertyWithDefault<idx_t>(214, "excluded_table_index", result->excluded_table_index);
	deserializer.ReadPropertyWithDefault<vector<column_t>>(215, "columns_to_fetch", result->columns_to_fetch);
	deserializer.ReadPropertyWithDefault<vector<column_t>>(216, "source_columns", result->source_columns);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(217, "expressions", result->expressions);
	deserializer.ReadPropertyWithExplicitDefault<bool>(218, "update_is_del_and_insert", result->update_is_del_and_insert, false);
	return std::move(result);
}